

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayStencilAttachments.cpp
# Opt level: O0

void __thiscall
glcts::TextureCubeMapArrayStencilAttachments::fillStencilData
          (TextureCubeMapArrayStencilAttachments *this,GLuint test_index)

{
  GLuint GVar1;
  GLuint GVar2;
  GLuint GVar3;
  GLubyte *__s;
  GLuint index_array;
  GLuint x_position_in_array;
  GLuint y_position_in_array;
  GLuint depth_position_in_array;
  GLuint y;
  GLuint x;
  GLuint depth_index;
  GLubyte *data;
  GLuint test_index_local;
  TextureCubeMapArrayStencilAttachments *this_local;
  
  __s = CubeMapArrayDataStorage::getDataArray(this->m_cube_map_array_data + test_index);
  GVar1 = CubeMapArrayDataStorage::getArraySize(this->m_cube_map_array_data + test_index);
  memset(__s,0,(ulong)GVar1);
  y = 0;
  while( true ) {
    GVar1 = CubeMapArrayDataStorage::getDepth(this->m_cube_map_array_data + test_index);
    if (GVar1 <= y) break;
    depth_position_in_array = 0;
    while( true ) {
      GVar1 = CubeMapArrayDataStorage::getWidth(this->m_cube_map_array_data + test_index);
      if (GVar1 <= depth_position_in_array) break;
      GVar1 = CubeMapArrayDataStorage::getHeight(this->m_cube_map_array_data + test_index);
      y_position_in_array = GVar1 >> 1;
      while( true ) {
        GVar1 = CubeMapArrayDataStorage::getHeight(this->m_cube_map_array_data + test_index);
        if (GVar1 <= y_position_in_array) break;
        GVar1 = CubeMapArrayDataStorage::getWidth(this->m_cube_map_array_data + test_index);
        GVar2 = CubeMapArrayDataStorage::getHeight(this->m_cube_map_array_data + test_index);
        GVar3 = CubeMapArrayDataStorage::getHeight(this->m_cube_map_array_data + test_index);
        memset(__s + (GVar1 * GVar2 * 4 * y + GVar3 * 4 * y_position_in_array +
                     depth_position_in_array * 4),1,4);
        y_position_in_array = y_position_in_array + 1;
      }
      depth_position_in_array = depth_position_in_array + 1;
    }
    y = y + 1;
  }
  return;
}

Assistant:

void TextureCubeMapArrayStencilAttachments::fillStencilData(glw::GLuint test_index)
{
	glw::GLubyte* const data = m_cube_map_array_data[test_index].getDataArray();

	memset(data, 0, m_cube_map_array_data[test_index].getArraySize() * sizeof(glw::GLubyte));

	for (glw::GLuint depth_index = 0; depth_index < m_cube_map_array_data[test_index].getDepth(); depth_index++)
	{
		for (glw::GLuint x = 0; x < m_cube_map_array_data[test_index].getWidth(); x++)
		{
			for (glw::GLuint y = m_cube_map_array_data[test_index].getHeight() / 2;
				 y < m_cube_map_array_data[test_index].getHeight(); y++)
			{
				glw::GLuint depth_position_in_array = m_cube_map_array_data[test_index].getWidth() *
													  m_cube_map_array_data[test_index].getHeight() * m_n_components *
													  depth_index;

				glw::GLuint y_position_in_array = m_cube_map_array_data[test_index].getHeight() * m_n_components * y;

				glw::GLuint x_position_in_array = m_n_components * x;

				glw::GLuint index_array = depth_position_in_array + y_position_in_array + x_position_in_array;

				memset((data + index_array), 1, m_n_components);

			} /* for (all rows) */
		}	 /* for (all columns) */
	}		  /* for (all layers) */
}